

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

void initialise_ecurve(ec_curve *curve,mp_int *p,mp_int *d,mp_int *a,mp_int *nonsquare,mp_int *G_x,
                      mp_int *G_y,mp_int *G_order,uint log2_cofactor)

{
  mp_int *pmVar1;
  size_t sVar2;
  EdwardsCurve *ec;
  EdwardsPoint *pEVar3;
  
  curve->type = EC_EDWARDS;
  pmVar1 = mp_copy(p);
  curve->p = pmVar1;
  sVar2 = mp_get_nbits(p);
  curve->fieldBits = sVar2;
  curve->fieldBytes = sVar2 + 8 >> 3;
  ec = ecc_edwards_curve(p,d,a,nonsquare);
  (curve->field_6).e.ec = ec;
  (curve->field_6).e.log2_cofactor = log2_cofactor;
  pEVar3 = ecc_edwards_point_new(ec,G_x,G_y);
  (curve->field_6).e.G = pEVar3;
  pmVar1 = mp_copy(G_order);
  (curve->field_6).w.G_order = pmVar1;
  return;
}

Assistant:

static void initialise_ecurve(
    struct ec_curve *curve, mp_int *p, mp_int *d, mp_int *a,
    mp_int *nonsquare, mp_int *G_x, mp_int *G_y, mp_int *G_order,
    unsigned log2_cofactor)
{
    /* Ensure curve->fieldBytes is long enough to store an extra bit
     * for a compressed point */
    initialise_common(curve, EC_EDWARDS, p, 1);

    curve->e.ec = ecc_edwards_curve(p, d, a, nonsquare);
    curve->e.log2_cofactor = log2_cofactor;

    curve->e.G = ecc_edwards_point_new(curve->e.ec, G_x, G_y);
    curve->e.G_order = mp_copy(G_order);
}